

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  int _h;
  _func_int *p_Var3;
  void *pvVar4;
  size_t sVar5;
  Allocator *pAVar6;
  int *piVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  Layer *pLVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  int _w;
  long lVar29;
  ulong uVar30;
  undefined4 *puVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long local_88;
  ParamDict pd;
  size_t local_68;
  Allocator *local_58;
  int local_4c;
  
  pLVar25 = create_layer(0xe);
  this->flatten = pLVar25;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  p_Var3 = this->_vptr_InnerProduct_x86[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x140 + (long)p_Var3) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar27 = *(int *)(&this->field_0xd8 + (long)p_Var3);
    _h = *(int *)(&this->field_0xd0 + (long)p_Var3);
    _w = iVar27 / _h;
    if ((((long)_h & 3U) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape((Mat *)&pd,(Mat *)(&this->field_0x130 + (long)p_Var3),_w,_h,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,_w,_h >> 2,0x10,4,(Allocator *)0x0);
      lVar26 = 3;
      lVar35 = 2;
      local_88 = 1;
      lVar29 = 0;
      for (uVar30 = 0; (long)(uVar30 | 3) < (long)_h; uVar30 = uVar30 + 4) {
        lVar28 = (long)(this->weight_data_tm).w;
        pvVar4 = (this->weight_data_tm).data;
        sVar5 = (this->weight_data_tm).elemsize;
        puVar31 = (undefined4 *)((uVar30 >> 2) * lVar28 * sVar5 + (long)pvVar4);
        lVar37 = (long)local_4c;
        lVar32 = local_68 * lVar26 * lVar37;
        lVar33 = local_68 * lVar35 * lVar37;
        lVar34 = local_68 * local_88 * lVar37;
        lVar37 = local_68 * uVar30 * lVar37;
        lVar28 = sVar5 * lVar29 * lVar28;
        lVar36 = 0;
        lVar38 = 0;
        for (iVar27 = 0; iVar27 + 3 < _w; iVar27 = iVar27 + 4) {
          puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar38 + lVar37);
          uVar8 = puVar1[1];
          uVar9 = puVar1[2];
          uVar10 = puVar1[3];
          puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar38 + lVar34);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          uVar13 = puVar2[2];
          uVar14 = puVar2[3];
          puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar38 + lVar33);
          uVar15 = *puVar2;
          uVar16 = puVar2[1];
          uVar17 = puVar2[2];
          uVar18 = puVar2[3];
          puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar38 + lVar32);
          uVar19 = *puVar2;
          uVar20 = puVar2[1];
          uVar21 = puVar2[2];
          uVar22 = puVar2[3];
          puVar2 = (undefined4 *)((long)pvVar4 + lVar38 * 4 + lVar28);
          *puVar2 = *puVar1;
          puVar2[1] = uVar11;
          puVar2[2] = uVar15;
          puVar2[3] = uVar19;
          puVar1 = (undefined4 *)((long)pvVar4 + lVar38 * 4 + lVar28 + 0x10);
          *puVar1 = uVar8;
          puVar1[1] = uVar12;
          puVar1[2] = uVar16;
          puVar1[3] = uVar20;
          puVar1 = (undefined4 *)((long)pvVar4 + lVar38 * 4 + lVar28 + 0x20);
          *puVar1 = uVar9;
          puVar1[1] = uVar13;
          puVar1[2] = uVar17;
          puVar1[3] = uVar21;
          puVar1 = (undefined4 *)((long)pvVar4 + lVar38 * 4 + lVar28 + 0x30);
          *puVar1 = uVar10;
          puVar1[1] = uVar14;
          puVar1[2] = uVar18;
          puVar1[3] = uVar22;
          puVar31 = puVar31 + 0x10;
          lVar38 = lVar38 + 0x10;
          lVar36 = lVar36 + 4;
        }
        for (; (int)lVar36 < _w; lVar36 = lVar36 + 1) {
          *puVar31 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar36 * 4 + lVar37);
          puVar31[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar36 * 4 + lVar34);
          puVar31[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar36 * 4 + lVar33);
          puVar31[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar36 * 4 + lVar32);
          puVar31 = puVar31 + 4;
        }
        lVar26 = lVar26 + 4;
        lVar35 = lVar35 + 4;
        local_88 = local_88 + 4;
        lVar29 = lVar29 + 1;
      }
      if (pd.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type == 0) {
          if (local_58 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
    }
    else if (p_Var3 != (_func_int *)0xfffffffffffffee0) {
      piVar7 = *(int **)(&this->field_0x138 + (long)p_Var3);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      piVar7 = (this->weight_data_tm).refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pvVar4 = (this->weight_data_tm).data;
          pAVar6 = (this->weight_data_tm).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            free(pvVar4);
          }
          else {
            (*pAVar6->_vptr_Allocator[3])(pAVar6,pvVar4,(long)iVar27 % (long)_h & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      piVar7 = *(int **)(&this->field_0x138 + (long)p_Var3);
      (this->weight_data_tm).data = ((Mat *)(&this->field_0x130 + (long)p_Var3))->data;
      (this->weight_data_tm).refcount = piVar7;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var3);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var3);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var3);
      uVar23 = *(undefined8 *)(&this->field_0x158 + (long)p_Var3);
      uVar24 = *(undefined8 *)(&this->field_0x160 + (long)p_Var3);
      (this->weight_data_tm).dims = (int)uVar23;
      (this->weight_data_tm).w = (int)((ulong)uVar23 >> 0x20);
      (this->weight_data_tm).h = (int)uVar24;
      (this->weight_data_tm).d = (int)((ulong)uVar24 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var3);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var3);
    }
    if (opt->lightmode == true) {
      p_Var3 = this->_vptr_InnerProduct_x86[-3];
      piVar7 = *(int **)(&this->field_0x138 + (long)p_Var3);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (*(long **)(&this->field_0x150 + (long)p_Var3) == (long *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var3));
          }
          else {
            (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var3) + 0x18))();
          }
        }
      }
      *(undefined8 *)(&this->field_0x170 + (long)p_Var3) = 0;
      *(undefined8 *)(&this->field_0x13c + (long)p_Var3) = 0;
      *(undefined8 *)(&this->field_0x144 + (long)p_Var3) = 0;
      *(undefined8 *)(&this->field_0x130 + (long)p_Var3) = 0;
      *(undefined8 *)(&this->field_0x138 + (long)p_Var3) = 0;
      *(undefined8 *)(&this->field_0x158 + (long)p_Var3) = 0;
      *(undefined8 *)(&this->field_0x160 + (long)p_Var3) = 0;
      *(undefined4 *)(&this->field_0x168 + (long)p_Var3) = 0;
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}